

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator.cpp
# Opt level: O3

void __thiscall
helics::Translator::Translator(Translator *this,Core *core,string_view translatorName)

{
  Core *pCVar1;
  int iVar2;
  char *pcVar3;
  undefined8 in_R9;
  
  pcVar3 = translatorName._M_str;
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR__Interface_004c9f08;
  (this->super_Interface).mCore = core;
  (this->super_Interface).handle.hid = -1700000000;
  (this->super_Interface).mName._M_dataplus._M_p = (pointer)&(this->super_Interface).mName.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->super_Interface).mName,pcVar3,pcVar3 + translatorName._M_len);
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR__Translator_004cc1d0;
  this->disableAssign = false;
  (this->transOp).super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->transOp).super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pCVar1 = (this->super_Interface).mCore;
  if (pCVar1 != (Core *)0x0) {
    iVar2 = (*pCVar1->_vptr_Core[0x3c])(pCVar1,translatorName._M_len,pcVar3,0,0,in_R9,0,0);
    (this->super_Interface).handle.hid = iVar2;
  }
  return;
}

Assistant:

Translator::Translator(Core* core, const std::string_view translatorName):
    Interface(core, InterfaceHandle(), translatorName)
{
    if (mCore != nullptr) {
        handle = mCore->registerTranslator(translatorName, std::string_view{}, std::string_view{});
    }
}